

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  ulong uVar1;
  size_t k;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  char cVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  uint uVar34;
  undefined4 uVar35;
  uint uVar36;
  ulong uVar37;
  RayQueryContext *pRVar38;
  int iVar39;
  long lVar40;
  ulong *puVar41;
  NodeRef root;
  undefined1 (*pauVar42) [32];
  bool bVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar44;
  float fVar58;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 in_ZMM0 [64];
  float fVar62;
  float fVar63;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar64 [16];
  float fVar72;
  float fVar74;
  float fVar78;
  float fVar80;
  float fVar82;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar79;
  float fVar81;
  float fVar83;
  undefined1 auVar68 [32];
  undefined1 auVar65 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar105;
  undefined1 auVar104 [32];
  undefined1 auVar106 [16];
  float in_register_0000131c;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar113;
  undefined1 auVar112 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float in_register_0000135c;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vfloat4 a0;
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 in_ZMM15 [64];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  vbool<8> valid_o;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5d00 [20];
  uint uStack_5cec;
  uint uStack_5ce8;
  uint uStack_5ce4;
  undefined1 local_5ce0 [32];
  undefined4 local_5cc0;
  undefined4 uStack_5cbc;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  undefined1 local_5ca0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c80;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined4 local_5aa0 [16];
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  float fStack_5a04;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  float fStack_59e4;
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  float fStack_59c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar49 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar94 = vpcmpeqd_avx(auVar49,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar49 = vpcmpeqd_avx(auVar49,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar67 = *(undefined1 (*) [32])(ray + 0x100);
    auVar99 = vcmpps_avx(auVar67,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar66._16_16_ = auVar49;
    auVar66._0_16_ = auVar94;
    local_5ac0 = vandps_avx(auVar99,auVar66);
    uVar34 = vmovmskps_avx(local_5ac0);
    if (uVar34 != 0) {
      _local_5c20 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5c00 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5be0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar107._0_4_ =
           local_5c20._0_4_ * local_5c20._0_4_ +
           local_5be0._0_4_ * local_5be0._0_4_ + local_5c00._0_4_ * local_5c00._0_4_;
      auVar107._4_4_ =
           local_5c20._4_4_ * local_5c20._4_4_ +
           local_5be0._4_4_ * local_5be0._4_4_ + local_5c00._4_4_ * local_5c00._4_4_;
      auVar107._8_4_ =
           local_5c20._8_4_ * local_5c20._8_4_ +
           local_5be0._8_4_ * local_5be0._8_4_ + local_5c00._8_4_ * local_5c00._8_4_;
      auVar107._12_4_ =
           local_5c20._12_4_ * local_5c20._12_4_ +
           local_5be0._12_4_ * local_5be0._12_4_ + local_5c00._12_4_ * local_5c00._12_4_;
      auVar107._16_4_ =
           local_5c20._16_4_ * local_5c20._16_4_ +
           local_5be0._16_4_ * local_5be0._16_4_ + local_5c00._16_4_ * local_5c00._16_4_;
      auVar107._20_4_ =
           local_5c20._20_4_ * local_5c20._20_4_ +
           local_5be0._20_4_ * local_5be0._20_4_ + local_5c00._20_4_ * local_5c00._20_4_;
      auVar107._24_4_ =
           local_5c20._24_4_ * local_5c20._24_4_ +
           local_5be0._24_4_ * local_5be0._24_4_ + local_5c00._24_4_ * local_5c00._24_4_;
      auVar107._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar99 = vrsqrtps_avx(auVar107);
      uVar37 = (ulong)(uVar34 & 0xff);
      fVar114 = auVar99._0_4_;
      fVar119 = auVar99._4_4_;
      fVar120 = auVar99._8_4_;
      fVar121 = auVar99._12_4_;
      fVar62 = auVar99._16_4_;
      fVar72 = auVar99._20_4_;
      fVar74 = auVar99._24_4_;
      local_59c0.v[0] = fVar114 * 1.5 + fVar114 * fVar114 * fVar114 * auVar107._0_4_ * -0.5;
      local_59c0.v[1] = fVar119 * 1.5 + fVar119 * fVar119 * fVar119 * auVar107._4_4_ * -0.5;
      local_59c0.v[2] = fVar120 * 1.5 + fVar120 * fVar120 * fVar120 * auVar107._8_4_ * -0.5;
      local_59c0.v[3] = fVar121 * 1.5 + fVar121 * fVar121 * fVar121 * auVar107._12_4_ * -0.5;
      local_59c0.v[4] = fVar62 * 1.5 + fVar62 * fVar62 * fVar62 * auVar107._16_4_ * -0.5;
      local_59c0.v[5] = fVar72 * 1.5 + fVar72 * fVar72 * fVar72 * auVar107._20_4_ * -0.5;
      local_59c0.v[6] = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar107._24_4_ * -0.5;
      local_59c0.v[7] = auVar107._28_4_ + 1.5;
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      auVar94 = ZEXT816(0) << 0x20;
      do {
        lVar40 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
          }
        }
        auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar40 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar40 * 4 + 0xa0)),0x1c);
        auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + lVar40 * 4 + 0xc0)),0x28);
        fVar114 = *(float *)((long)&local_59c0 + lVar40 * 4);
        auVar138._0_4_ = auVar65._0_4_ * fVar114;
        auVar138._4_4_ = auVar65._4_4_ * fVar114;
        auVar138._8_4_ = auVar65._8_4_ * fVar114;
        auVar138._12_4_ = auVar65._12_4_ * fVar114;
        auVar144 = vshufpd_avx(auVar138,auVar138,1);
        auVar65 = vmovshdup_avx(auVar138);
        auVar140 = vunpckhps_avx(auVar138,auVar94);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = (ulong)auVar65._0_4_ ^ 0x80000000;
        auVar141 = vshufps_avx(auVar140,auVar143,0x41);
        auVar140._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
        auVar140._8_8_ = auVar144._8_8_ ^ auVar49._8_8_;
        auVar140 = vinsertps_avx(auVar140,auVar138,0x2a);
        auVar65 = vdpps_avx(auVar141,auVar141,0x7f);
        auVar144 = vdpps_avx(auVar140,auVar140,0x7f);
        auVar65 = vcmpps_avx(auVar144,auVar65,1);
        auVar65 = vshufps_avx(auVar65,auVar65,0);
        auVar65 = vblendvps_avx(auVar140,auVar141,auVar65);
        auVar144 = vdpps_avx(auVar65,auVar65,0x7f);
        auVar140 = vrsqrtss_avx(auVar144,auVar144);
        fVar119 = auVar140._0_4_;
        auVar144 = ZEXT416((uint)(fVar119 * 1.5 - auVar144._0_4_ * 0.5 * fVar119 * fVar119 * fVar119
                                 ));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar141._0_4_ = auVar65._0_4_ * auVar144._0_4_;
        auVar141._4_4_ = auVar65._4_4_ * auVar144._4_4_;
        auVar141._8_4_ = auVar65._8_4_ * auVar144._8_4_;
        auVar141._12_4_ = auVar65._12_4_ * auVar144._12_4_;
        auVar65 = vshufps_avx(auVar141,auVar141,0xc9);
        auVar144 = vshufps_avx(auVar138,auVar138,0xc9);
        auVar146._0_4_ = auVar144._0_4_ * auVar141._0_4_;
        auVar146._4_4_ = auVar144._4_4_ * auVar141._4_4_;
        auVar146._8_4_ = auVar144._8_4_ * auVar141._8_4_;
        auVar146._12_4_ = auVar144._12_4_ * auVar141._12_4_;
        auVar144._0_4_ = auVar138._0_4_ * auVar65._0_4_;
        auVar144._4_4_ = auVar138._4_4_ * auVar65._4_4_;
        auVar144._8_4_ = auVar138._8_4_ * auVar65._8_4_;
        auVar144._12_4_ = auVar138._12_4_ * auVar65._12_4_;
        auVar65 = vsubps_avx(auVar144,auVar146);
        auVar140 = vshufps_avx(auVar65,auVar65,0xc9);
        auVar65 = vdpps_avx(auVar140,auVar140,0x7f);
        lVar40 = lVar40 * 0x30;
        auVar144 = vrsqrtss_avx(auVar65,auVar65);
        fVar119 = auVar144._0_4_;
        auVar65 = ZEXT416((uint)(fVar119 * 1.5 - auVar65._0_4_ * 0.5 * fVar119 * fVar119 * fVar119))
        ;
        auVar65 = vshufps_avx(auVar65,auVar65,0);
        auVar145._0_4_ = auVar65._0_4_ * auVar140._0_4_;
        auVar145._4_4_ = auVar65._4_4_ * auVar140._4_4_;
        auVar145._8_4_ = auVar65._8_4_ * auVar140._8_4_;
        auVar145._12_4_ = auVar65._12_4_ * auVar140._12_4_;
        auVar65._0_4_ = fVar114 * auVar138._0_4_;
        auVar65._4_4_ = fVar114 * auVar138._4_4_;
        auVar65._8_4_ = fVar114 * auVar138._8_4_;
        auVar65._12_4_ = fVar114 * auVar138._12_4_;
        auVar140 = vunpcklps_avx(auVar141,auVar65);
        auVar65 = vunpckhps_avx(auVar141,auVar65);
        auVar141 = vunpcklps_avx(auVar145,auVar94);
        auVar144 = vunpckhps_avx(auVar145,auVar94);
        auVar144 = vunpcklps_avx(auVar65,auVar144);
        auVar138 = vunpcklps_avx(auVar140,auVar141);
        auVar65 = vunpckhps_avx(auVar140,auVar141);
        *(undefined1 (*) [16])(local_59a0 + lVar40) = auVar138;
        *(undefined1 (*) [16])(auStack_5990 + lVar40) = auVar65;
        *(undefined1 (*) [16])(auStack_5980 + lVar40) = auVar144;
        uVar37 = uVar37 & uVar37 - 1;
      } while (uVar37 != 0);
      local_5c80._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5c80._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5c80._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5c80._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5c80._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5c80._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5c80._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5c80._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5c80._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5c80._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5c80._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5c80._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5c80._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5c80._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5c80._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5c80._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5c80._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5c80._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5c80._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5c80._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5c80._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5c80._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5c80._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5c80._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar124._8_4_ = 0x7fffffff;
      auVar124._0_8_ = 0x7fffffff7fffffff;
      auVar124._12_4_ = 0x7fffffff;
      auVar124._16_4_ = 0x7fffffff;
      auVar124._20_4_ = 0x7fffffff;
      auVar124._24_4_ = 0x7fffffff;
      auVar124._28_4_ = 0x7fffffff;
      auVar136._8_4_ = 0x219392ef;
      auVar136._0_8_ = 0x219392ef219392ef;
      auVar136._12_4_ = 0x219392ef;
      auVar136._16_4_ = 0x219392ef;
      auVar136._20_4_ = 0x219392ef;
      auVar136._24_4_ = 0x219392ef;
      auVar136._28_4_ = 0x219392ef;
      auVar139._8_4_ = 0x3f800000;
      auVar139._0_8_ = &DAT_3f8000003f800000;
      auVar139._12_4_ = 0x3f800000;
      auVar139._16_4_ = 0x3f800000;
      auVar139._20_4_ = 0x3f800000;
      auVar139._24_4_ = 0x3f800000;
      auVar139._28_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar139,_local_5c20);
      auVar99 = vandps_avx(_local_5c20,auVar124);
      auVar66 = vcmpps_avx(auVar99,auVar136,1);
      auVar99 = vandps_avx(_local_5c00,auVar124);
      auVar107 = vcmpps_avx(auVar99,auVar136,1);
      auVar96 = vdivps_avx(auVar139,_local_5c00);
      auVar99 = vandps_avx(_local_5be0,auVar124);
      auVar128._8_4_ = 0x5d5e0b6b;
      auVar128._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar128._12_4_ = 0x5d5e0b6b;
      auVar128._16_4_ = 0x5d5e0b6b;
      auVar128._20_4_ = 0x5d5e0b6b;
      auVar128._24_4_ = 0x5d5e0b6b;
      auVar128._28_4_ = 0x5d5e0b6b;
      _local_5bc0 = vblendvps_avx(auVar95,auVar128,auVar66);
      auVar99 = vcmpps_avx(auVar99,auVar136,1);
      auVar66 = vdivps_avx(auVar139,_local_5be0);
      _local_5ba0 = vblendvps_avx(auVar96,auVar128,auVar107);
      _local_5b80 = vblendvps_avx(auVar66,auVar128,auVar99);
      auVar99 = vcmpps_avx(_local_5bc0,ZEXT832(0) << 0x20,1);
      auVar95._8_4_ = 0x20;
      auVar95._0_8_ = 0x2000000020;
      auVar95._12_4_ = 0x20;
      auVar95._16_4_ = 0x20;
      auVar95._20_4_ = 0x20;
      auVar95._24_4_ = 0x20;
      auVar95._28_4_ = 0x20;
      local_5b60 = vandps_avx(auVar99,auVar95);
      auVar99 = vcmpps_avx(_local_5ba0,ZEXT832(0) << 0x20,5);
      auVar96._8_4_ = 0x40;
      auVar96._0_8_ = 0x4000000040;
      auVar96._12_4_ = 0x40;
      auVar96._16_4_ = 0x40;
      auVar96._20_4_ = 0x40;
      auVar96._24_4_ = 0x40;
      auVar96._28_4_ = 0x40;
      auVar117._8_4_ = 0x60;
      auVar117._0_8_ = 0x6000000060;
      auVar117._12_4_ = 0x60;
      auVar117._16_4_ = 0x60;
      auVar117._20_4_ = 0x60;
      auVar117._24_4_ = 0x60;
      auVar117._28_4_ = 0x60;
      local_5b40 = vblendvps_avx(auVar117,auVar96,auVar99);
      auVar66 = ZEXT832(0) << 0x20;
      auVar99 = vcmpps_avx(_local_5b80,auVar66,5);
      auVar97._8_4_ = 0x80;
      auVar97._0_8_ = 0x8000000080;
      auVar97._12_4_ = 0x80;
      auVar97._16_4_ = 0x80;
      auVar97._20_4_ = 0x80;
      auVar97._24_4_ = 0x80;
      auVar97._28_4_ = 0x80;
      auVar108._8_4_ = 0xa0;
      auVar108._0_8_ = 0xa0000000a0;
      auVar108._12_4_ = 0xa0;
      auVar108._16_4_ = 0xa0;
      auVar108._20_4_ = 0xa0;
      auVar108._24_4_ = 0xa0;
      auVar108._28_4_ = 0xa0;
      local_5b20 = vblendvps_avx(auVar108,auVar97,auVar99);
      auVar99 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar66);
      auVar98._8_4_ = 0x7f800000;
      auVar98._0_8_ = 0x7f8000007f800000;
      auVar98._12_4_ = 0x7f800000;
      auVar98._16_4_ = 0x7f800000;
      auVar98._20_4_ = 0x7f800000;
      auVar98._24_4_ = 0x7f800000;
      auVar98._28_4_ = 0x7f800000;
      auVar91 = ZEXT3264(local_5ac0);
      local_5b00 = vblendvps_avx(auVar98,auVar99,local_5ac0);
      auVar67 = vmaxps_avx(auVar67,auVar66);
      auVar99._8_4_ = 0xff800000;
      auVar99._0_8_ = 0xff800000ff800000;
      auVar99._12_4_ = 0xff800000;
      auVar99._16_4_ = 0xff800000;
      auVar99._20_4_ = 0xff800000;
      auVar99._24_4_ = 0xff800000;
      auVar99._28_4_ = 0xff800000;
      local_5ae0 = vblendvps_avx(auVar99,auVar67,local_5ac0);
      auVar67 = vcmpps_avx(local_5ae0,local_5ae0,0xf);
      local_5d00._4_4_ = local_5ac0._4_4_ ^ auVar67._4_4_;
      local_5d00._0_4_ = local_5ac0._0_4_ ^ auVar67._0_4_;
      local_5d00._8_4_ = local_5ac0._8_4_ ^ auVar67._8_4_;
      local_5d00._12_4_ = local_5ac0._12_4_ ^ auVar67._12_4_;
      local_5d00._16_4_ = local_5ac0._16_4_ ^ auVar67._16_4_;
      uStack_5cec = local_5ac0._20_4_ ^ auVar67._20_4_;
      uStack_5ce8 = local_5ac0._24_4_ ^ auVar67._24_4_;
      uStack_5ce4 = local_5ac0._28_4_ ^ auVar67._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 7;
      }
      else {
        uVar34 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      pRVar38 = (RayQueryContext *)0x0;
      puVar41 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar42 = (undefined1 (*) [32])local_4640;
      local_4680 = 0x7f800000;
      uStack_467c = 0x7f800000;
      uStack_4678 = 0x7f800000;
      uStack_4674 = 0x7f800000;
      uStack_4670 = 0x7f800000;
      uStack_466c = 0x7f800000;
      uStack_4668 = 0x7f800000;
      uStack_4664 = 0x7f800000;
      local_5808 = (bvh->root).ptr;
      local_5aa0._32_8_ = mm_lookupmask_ps._16_8_;
      local_5aa0._40_8_ = mm_lookupmask_ps._24_8_;
      local_5aa0._48_8_ = mm_lookupmask_ps._16_8_;
      local_5aa0._56_8_ = mm_lookupmask_ps._24_8_;
      local_4660 = local_5b00;
      do {
        auVar49 = auVar91._0_16_;
        pauVar42 = pauVar42 + -1;
        root.ptr = puVar41[-1];
        puVar41 = puVar41 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00493119:
          iVar39 = 3;
        }
        else {
          auVar67 = *pauVar42;
          auVar71 = ZEXT3264(auVar67);
          auVar99 = vcmpps_avx(auVar67,local_5ae0,1);
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar99 >> 0x7f,0) == '\0') &&
                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0xbf,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar99[0x1f]) {
            iVar39 = 2;
          }
          else {
            uVar35 = vmovmskps_avx(auVar99);
            pRVar38 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar38 >> 0x20),uVar35);
            iVar39 = 0;
            if ((uint)POPCOUNT(uVar35) <= uVar34) {
              while (local_5ce0 = auVar67, pRVar38 != (RayQueryContext *)0x0) {
                local_5ca0._0_8_ = pRVar38;
                k = 0;
                if (pRVar38 != (RayQueryContext *)0x0) {
                  for (; ((ulong)pRVar38 >> k & 1) == 0; k = k + 1) {
                  }
                }
                local_5cc0 = (undefined4)k;
                uStack_5cbc = (undefined4)(k >> 0x20);
                auVar91 = ZEXT1664(auVar91._0_16_);
                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                bVar43 = occluded1(This,bvh,root,k,(Precalculations *)&local_59c0,ray,
                                   (TravRayK<8,_true> *)&local_5c80.field_0,context);
                auVar49 = auVar91._0_16_;
                if (bVar43) {
                  *(undefined4 *)(local_5d00 + CONCAT44(uStack_5cbc,local_5cc0) * 4) = 0xffffffff;
                }
                auVar67 = local_5ce0;
                pRVar38 = (RayQueryContext *)(local_5ca0._0_8_ & local_5ca0._0_8_ - 1);
              }
              auVar49 = vpcmpeqd_avx(auVar49,auVar49);
              auVar94 = vpcmpgtd_avx(stack0xffffffffffffa310,auVar49);
              auVar49 = vpcmpgtd_avx(local_5d00._0_16_,auVar49);
              auVar91 = ZEXT1664(auVar49);
              auVar49 = vpor_avx(auVar49,auVar94);
              iVar39 = 3;
              auVar71 = ZEXT3264(local_5ce0);
              pRVar38 = (RayQueryContext *)0x0;
              if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar49[0xf] < '\0') {
                auVar67._8_4_ = 0xff800000;
                auVar67._0_8_ = 0xff800000ff800000;
                auVar67._12_4_ = 0xff800000;
                auVar67._16_4_ = 0xff800000;
                auVar67._20_4_ = 0xff800000;
                auVar67._24_4_ = 0xff800000;
                auVar67._28_4_ = 0xff800000;
                auVar91 = ZEXT3264(auVar67);
                local_5ae0 = vblendvps_avx(local_5ae0,auVar67,_local_5d00);
                auVar71 = ZEXT3264(local_5ce0);
                iVar39 = 2;
              }
            }
            if (uVar34 < (uint)POPCOUNT(uVar35)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00493119;
                  auVar67 = vcmpps_avx(local_5ae0,auVar71._0_32_,6);
                  if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar67 >> 0x7f,0) == '\0') &&
                        (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar67 >> 0xbf,0) == '\0') &&
                      (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar67[0x1f]) {
                    iVar39 = 2;
                  }
                  else {
                    local_5cc0 = local_5d00._0_4_;
                    uStack_5cbc = local_5d00._4_4_;
                    fStack_5cb8 = local_5d00._8_4_;
                    fStack_5cb4 = local_5d00._12_4_;
                    fStack_5cb0 = local_5d00._16_4_;
                    fStack_5cac = local_5d00._20_4_;
                    fStack_5ca8 = local_5d00._24_4_;
                    fStack_5ca4 = local_5d00._28_4_;
                    pRVar38 = (RayQueryContext *)This->leafIntersector;
                    local_5aa0[0] = local_5aa0[8];
                    local_5aa0[1] = local_5aa0[9];
                    local_5aa0[2] = local_5aa0[10];
                    local_5aa0[3] = local_5aa0[0xb];
                    local_5aa0[4] = local_5aa0[0xc];
                    local_5aa0[5] = local_5aa0[0xd];
                    local_5aa0[6] = local_5aa0[0xe];
                    local_5aa0[7] = local_5aa0[0xf];
                    auVar49 = vpcmpeqd_avx(auVar91._0_16_,auVar91._0_16_);
                    auVar91 = ZEXT1664(auVar49);
                    auVar94 = vpcmpgtd_avx(stack0xffffffffffffa310,auVar49);
                    auVar65 = vpcmpgtd_avx(local_5d00._0_16_,auVar49);
                    auVar55._16_16_ = auVar94;
                    auVar55._0_16_ = auVar65;
                    iVar39 = vmovmskps_avx(auVar55);
                    if (iVar39 != 0) {
                      uVar37 = (ulong)(byte)iVar39;
                      local_5ca0._0_8_ =
                           (long)pRVar38 +
                           (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28;
                      do {
                        lVar40 = 0;
                        if (uVar37 != 0) {
                          for (; (uVar37 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                          }
                        }
                        local_5ce0._0_8_ = lVar40;
                        auVar91 = ZEXT1664(auVar91._0_16_);
                        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                        pRVar38 = context;
                        cVar32 = (**(code **)local_5ca0._0_8_)
                                           (&local_59c0,ray,lVar40,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        auVar49 = auVar91._0_16_;
                        if (cVar32 != '\0') {
                          local_5aa0[local_5ce0._0_8_] = 0xffffffff;
                        }
                        uVar37 = uVar37 & uVar37 - 1;
                      } while (uVar37 != 0);
                    }
                    auVar22._4_4_ = uStack_5cbc;
                    auVar22._0_4_ = local_5cc0;
                    auVar22._8_4_ = fStack_5cb8;
                    auVar22._12_4_ = fStack_5cb4;
                    auVar22._16_4_ = fStack_5cb0;
                    auVar22._20_4_ = fStack_5cac;
                    auVar22._24_4_ = fStack_5ca8;
                    auVar22._28_4_ = fStack_5ca4;
                    auVar26._8_4_ = local_5aa0[2];
                    auVar26._12_4_ = local_5aa0[3];
                    auVar26._0_4_ = local_5aa0[0];
                    auVar26._4_4_ = local_5aa0[1];
                    auVar26._16_4_ = local_5aa0[4];
                    auVar26._20_4_ = local_5aa0[5];
                    auVar26._24_4_ = local_5aa0[6];
                    auVar26._28_4_ = local_5aa0[7];
                    _local_5d00 = vorps_avx(auVar22,auVar26);
                    auVar49 = vpcmpeqd_avx(auVar49,auVar49);
                    auVar94 = vpcmpgtd_avx(local_5d00._16_16_,auVar49);
                    auVar49 = vpcmpgtd_avx(local_5d00._0_16_,auVar49);
                    auVar91 = ZEXT1664(auVar49);
                    auVar49 = vpor_avx(auVar49,auVar94);
                    if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar49[0xf]) {
                      iVar39 = 3;
                    }
                    else {
                      auVar90._8_4_ = 0xff800000;
                      auVar90._0_8_ = 0xff800000ff800000;
                      auVar90._12_4_ = 0xff800000;
                      auVar90._16_4_ = 0xff800000;
                      auVar90._20_4_ = 0xff800000;
                      auVar90._24_4_ = 0xff800000;
                      auVar90._28_4_ = 0xff800000;
                      auVar91 = ZEXT3264(auVar90);
                      local_5ae0 = vblendvps_avx(local_5ae0,auVar90,_local_5d00);
                      iVar39 = 0;
                    }
                  }
                  break;
                }
                uVar33 = root.ptr & 0xfffffffffffffff0;
                uVar36 = (uint)root.ptr & 7;
                local_5ca0 = vcmpps_avx(local_5ae0,auVar71._0_32_,6);
                auVar71 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar37 = 0;
                root.ptr = 8;
                do {
                  uVar1 = *(ulong *)(uVar33 + uVar37 * 8);
                  if (uVar1 != 8) {
                    auVar67 = auVar71._0_32_;
                    if ((uVar36 == 6) || (uVar36 == 1)) {
                      fVar114 = *(float *)(uVar33 + 0x100 + uVar37 * 4);
                      fVar119 = *(float *)(uVar33 + 0x40 + uVar37 * 4);
                      auVar99 = *(undefined1 (*) [32])(ray + 0xe0);
                      fVar62 = auVar99._0_4_;
                      fVar72 = auVar99._4_4_;
                      fVar74 = auVar99._8_4_;
                      fVar76 = auVar99._12_4_;
                      fVar78 = auVar99._16_4_;
                      fVar80 = auVar99._20_4_;
                      fVar82 = auVar99._24_4_;
                      fVar120 = *(float *)(uVar33 + 0x140 + uVar37 * 4);
                      auVar50._0_4_ = fVar62 * fVar114 + fVar119;
                      auVar50._4_4_ = fVar72 * fVar114 + fVar119;
                      auVar50._8_4_ = fVar74 * fVar114 + fVar119;
                      auVar50._12_4_ = fVar76 * fVar114 + fVar119;
                      auVar50._16_4_ = fVar78 * fVar114 + fVar119;
                      auVar50._20_4_ = fVar80 * fVar114 + fVar119;
                      auVar50._24_4_ = fVar82 * fVar114 + fVar119;
                      auVar50._28_4_ = fVar114 + fVar119;
                      fVar114 = *(float *)(uVar33 + 0x80 + uVar37 * 4);
                      fVar119 = *(float *)(uVar33 + 0x180 + uVar37 * 4);
                      fVar121 = *(float *)(uVar33 + 0xc0 + uVar37 * 4);
                      auVar88._0_4_ = fVar62 * fVar120 + fVar114;
                      auVar88._4_4_ = fVar72 * fVar120 + fVar114;
                      auVar88._8_4_ = fVar74 * fVar120 + fVar114;
                      auVar88._12_4_ = fVar76 * fVar120 + fVar114;
                      auVar88._16_4_ = fVar78 * fVar120 + fVar114;
                      auVar88._20_4_ = fVar80 * fVar120 + fVar114;
                      auVar88._24_4_ = fVar82 * fVar120 + fVar114;
                      auVar88._28_4_ = fVar120 + fVar114;
                      fVar114 = *(float *)(uVar33 + 0x120 + uVar37 * 4);
                      auVar100._0_4_ = fVar62 * fVar119 + fVar121;
                      auVar100._4_4_ = fVar72 * fVar119 + fVar121;
                      auVar100._8_4_ = fVar74 * fVar119 + fVar121;
                      auVar100._12_4_ = fVar76 * fVar119 + fVar121;
                      auVar100._16_4_ = fVar78 * fVar119 + fVar121;
                      auVar100._20_4_ = fVar80 * fVar119 + fVar121;
                      auVar100._24_4_ = fVar82 * fVar119 + fVar121;
                      auVar100._28_4_ = fVar120 + fVar121;
                      fVar119 = *(float *)(uVar33 + 0x60 + uVar37 * 4);
                      fVar120 = *(float *)(uVar33 + 0x160 + uVar37 * 4);
                      fVar121 = *(float *)(uVar33 + 0xa0 + uVar37 * 4);
                      auVar109._0_4_ = fVar62 * fVar114 + fVar119;
                      auVar109._4_4_ = fVar72 * fVar114 + fVar119;
                      auVar109._8_4_ = fVar74 * fVar114 + fVar119;
                      auVar109._12_4_ = fVar76 * fVar114 + fVar119;
                      auVar109._16_4_ = fVar78 * fVar114 + fVar119;
                      auVar109._20_4_ = fVar80 * fVar114 + fVar119;
                      auVar109._24_4_ = fVar82 * fVar114 + fVar119;
                      auVar109._28_4_ = fVar114 + fVar119;
                      fVar114 = *(float *)(uVar33 + 0x1a0 + uVar37 * 4);
                      auVar118._0_4_ = fVar62 * fVar120 + fVar121;
                      auVar118._4_4_ = fVar72 * fVar120 + fVar121;
                      auVar118._8_4_ = fVar74 * fVar120 + fVar121;
                      auVar118._12_4_ = fVar76 * fVar120 + fVar121;
                      auVar118._16_4_ = fVar78 * fVar120 + fVar121;
                      auVar118._20_4_ = fVar80 * fVar120 + fVar121;
                      auVar118._24_4_ = fVar82 * fVar120 + fVar121;
                      auVar118._28_4_ = fVar119 + fVar121;
                      fVar119 = *(float *)(uVar33 + 0xe0 + uVar37 * 4);
                      auVar125._0_4_ = fVar62 * fVar114 + fVar119;
                      auVar125._4_4_ = fVar72 * fVar114 + fVar119;
                      auVar125._8_4_ = fVar74 * fVar114 + fVar119;
                      auVar125._12_4_ = fVar76 * fVar114 + fVar119;
                      auVar125._16_4_ = fVar78 * fVar114 + fVar119;
                      auVar125._20_4_ = fVar80 * fVar114 + fVar119;
                      auVar125._24_4_ = fVar82 * fVar114 + fVar119;
                      auVar125._28_4_ = fVar114 + fVar119;
                      auVar23._4_4_ = local_5c80._4_4_;
                      auVar23._0_4_ = local_5c80._0_4_;
                      auVar23._8_4_ = local_5c80._8_4_;
                      auVar23._12_4_ = local_5c80._12_4_;
                      auVar23._16_4_ = local_5c80._16_4_;
                      auVar23._20_4_ = local_5c80._20_4_;
                      auVar23._24_4_ = local_5c80._24_4_;
                      auVar23._28_4_ = local_5c80._28_4_;
                      auVar24._4_4_ = local_5c80._36_4_;
                      auVar24._0_4_ = local_5c80._32_4_;
                      auVar24._8_4_ = local_5c80._40_4_;
                      auVar24._12_4_ = local_5c80._44_4_;
                      auVar24._16_4_ = local_5c80._48_4_;
                      auVar24._20_4_ = local_5c80._52_4_;
                      auVar24._24_4_ = local_5c80._56_4_;
                      auVar24._28_4_ = local_5c80._60_4_;
                      auVar25._4_4_ = local_5c80._68_4_;
                      auVar25._0_4_ = local_5c80._64_4_;
                      auVar25._8_4_ = local_5c80._72_4_;
                      auVar25._12_4_ = local_5c80._76_4_;
                      auVar25._16_4_ = local_5c80._80_4_;
                      auVar25._20_4_ = local_5c80._84_4_;
                      auVar25._24_4_ = local_5c80._88_4_;
                      auVar25._28_4_ = local_5c80._92_4_;
                      auVar66 = vsubps_avx(auVar50,auVar23);
                      auVar45._0_4_ = (float)local_5bc0._0_4_ * auVar66._0_4_;
                      auVar45._4_4_ = (float)local_5bc0._4_4_ * auVar66._4_4_;
                      auVar45._8_4_ = fStack_5bb8 * auVar66._8_4_;
                      auVar45._12_4_ = fStack_5bb4 * auVar66._12_4_;
                      auVar2._16_4_ = fStack_5bb0 * auVar66._16_4_;
                      auVar2._0_16_ = auVar45;
                      auVar2._20_4_ = fStack_5bac * auVar66._20_4_;
                      auVar2._24_4_ = fStack_5ba8 * auVar66._24_4_;
                      auVar2._28_4_ = auVar66._28_4_;
                      auVar66 = vsubps_avx(auVar88,auVar24);
                      auVar84._0_4_ = (float)local_5ba0._0_4_ * auVar66._0_4_;
                      auVar84._4_4_ = (float)local_5ba0._4_4_ * auVar66._4_4_;
                      auVar84._8_4_ = fStack_5b98 * auVar66._8_4_;
                      auVar84._12_4_ = fStack_5b94 * auVar66._12_4_;
                      auVar3._16_4_ = fStack_5b90 * auVar66._16_4_;
                      auVar3._0_16_ = auVar84;
                      auVar3._20_4_ = fStack_5b8c * auVar66._20_4_;
                      auVar3._24_4_ = fStack_5b88 * auVar66._24_4_;
                      auVar3._28_4_ = auVar66._28_4_;
                      auVar66 = vsubps_avx(auVar100,auVar25);
                      auVar92._0_4_ = (float)local_5b80._0_4_ * auVar66._0_4_;
                      auVar92._4_4_ = (float)local_5b80._4_4_ * auVar66._4_4_;
                      auVar92._8_4_ = fStack_5b78 * auVar66._8_4_;
                      auVar92._12_4_ = fStack_5b74 * auVar66._12_4_;
                      auVar4._16_4_ = fStack_5b70 * auVar66._16_4_;
                      auVar4._0_16_ = auVar92;
                      auVar4._20_4_ = fStack_5b6c * auVar66._20_4_;
                      auVar4._24_4_ = fStack_5b68 * auVar66._24_4_;
                      auVar4._28_4_ = auVar66._28_4_;
                      auVar66 = vsubps_avx(auVar109,auVar23);
                      auVar106._0_4_ = (float)local_5bc0._0_4_ * auVar66._0_4_;
                      auVar106._4_4_ = (float)local_5bc0._4_4_ * auVar66._4_4_;
                      auVar106._8_4_ = fStack_5bb8 * auVar66._8_4_;
                      auVar106._12_4_ = fStack_5bb4 * auVar66._12_4_;
                      auVar5._16_4_ = fStack_5bb0 * auVar66._16_4_;
                      auVar5._0_16_ = auVar106;
                      auVar5._20_4_ = fStack_5bac * auVar66._20_4_;
                      auVar5._24_4_ = fStack_5ba8 * auVar66._24_4_;
                      auVar5._28_4_ = auVar66._28_4_;
                      auVar66 = vsubps_avx(auVar118,auVar24);
                      auVar115._0_4_ = (float)local_5ba0._0_4_ * auVar66._0_4_;
                      auVar115._4_4_ = (float)local_5ba0._4_4_ * auVar66._4_4_;
                      auVar115._8_4_ = fStack_5b98 * auVar66._8_4_;
                      auVar115._12_4_ = fStack_5b94 * auVar66._12_4_;
                      auVar6._16_4_ = fStack_5b90 * auVar66._16_4_;
                      auVar6._0_16_ = auVar115;
                      auVar6._20_4_ = fStack_5b8c * auVar66._20_4_;
                      auVar6._24_4_ = fStack_5b88 * auVar66._24_4_;
                      auVar6._28_4_ = auVar66._28_4_;
                      auVar66 = vsubps_avx(auVar125,auVar25);
                      auVar122._0_4_ = (float)local_5b80._0_4_ * auVar66._0_4_;
                      auVar122._4_4_ = (float)local_5b80._4_4_ * auVar66._4_4_;
                      auVar122._8_4_ = fStack_5b78 * auVar66._8_4_;
                      auVar122._12_4_ = fStack_5b74 * auVar66._12_4_;
                      auVar7._16_4_ = fStack_5b70 * auVar66._16_4_;
                      auVar7._0_16_ = auVar122;
                      auVar7._20_4_ = fStack_5b6c * auVar66._20_4_;
                      auVar7._24_4_ = fStack_5b68 * auVar66._24_4_;
                      auVar7._28_4_ = auVar66._28_4_;
                      auVar49 = vpminsd_avx(auVar2._16_16_,auVar5._16_16_);
                      auVar94 = vpminsd_avx(auVar45,auVar106);
                      auVar65 = vpminsd_avx(auVar3._16_16_,auVar6._16_16_);
                      auVar49 = vpmaxsd_avx(auVar49,auVar65);
                      auVar65 = vpminsd_avx(auVar84,auVar115);
                      auVar94 = vpmaxsd_avx(auVar94,auVar65);
                      auVar65 = vpminsd_avx(auVar92,auVar122);
                      auVar94 = vpmaxsd_avx(auVar94,auVar65);
                      auVar65 = vpminsd_avx(auVar4._16_16_,auVar7._16_16_);
                      in_ZMM15 = ZEXT1664(auVar65);
                      auVar49 = vpmaxsd_avx(auVar49,auVar65);
                      auVar65 = vpmaxsd_avx(auVar2._16_16_,auVar5._16_16_);
                      auVar144 = vpmaxsd_avx(auVar45,auVar106);
                      auVar140 = vpmaxsd_avx(auVar3._16_16_,auVar6._16_16_);
                      auVar140 = vpminsd_avx(auVar65,auVar140);
                      auVar65 = vpmaxsd_avx(auVar84,auVar115);
                      auVar144 = vpminsd_avx(auVar144,auVar65);
                      auVar65 = vpmaxsd_avx(auVar92,auVar122);
                      auVar65 = vpminsd_avx(auVar144,auVar65);
                      auVar85._0_4_ = auVar94._0_4_ * 0.99999964;
                      auVar85._4_4_ = auVar94._4_4_ * 0.99999964;
                      auVar85._8_4_ = auVar94._8_4_ * 0.99999964;
                      auVar85._12_4_ = auVar94._12_4_ * 0.99999964;
                      auVar8._16_4_ = auVar49._0_4_ * 0.99999964;
                      auVar8._0_16_ = auVar85;
                      auVar8._20_4_ = auVar49._4_4_ * 0.99999964;
                      auVar8._24_4_ = auVar49._8_4_ * 0.99999964;
                      auVar8._28_4_ = 0x3f7ffffa;
                      auVar91 = ZEXT3264(auVar8);
                      auVar49 = vpmaxsd_avx(auVar4._16_16_,auVar7._16_16_);
                      auVar49 = vpminsd_avx(auVar140,auVar49);
                      auVar46._0_4_ = auVar65._0_4_ * 1.0000004;
                      auVar46._4_4_ = auVar65._4_4_ * 1.0000004;
                      auVar46._8_4_ = auVar65._8_4_ * 1.0000004;
                      auVar46._12_4_ = auVar65._12_4_ * 1.0000004;
                      auVar9._16_4_ = auVar49._0_4_ * 1.0000004;
                      auVar9._0_16_ = auVar46;
                      auVar9._20_4_ = auVar49._4_4_ * 1.0000004;
                      auVar9._24_4_ = auVar49._8_4_ * 1.0000004;
                      auVar9._28_4_ = auVar49._12_4_;
                      auVar49 = vpmaxsd_avx(auVar85,local_5b00._0_16_);
                      auVar94 = vpmaxsd_avx(auVar8._16_16_,local_5b00._16_16_);
                      auVar65 = vpminsd_avx(auVar46,local_5ae0._0_16_);
                      auVar144 = vpminsd_avx(auVar9._16_16_,local_5ae0._16_16_);
                      auVar101._16_16_ = auVar94;
                      auVar101._0_16_ = auVar49;
                      auVar51._16_16_ = auVar144;
                      auVar51._0_16_ = auVar65;
                      auVar66 = vcmpps_avx(auVar101,auVar51,2);
                      if (uVar36 == 6) {
                        uVar35 = *(undefined4 *)(uVar33 + 0x1c0 + uVar37 * 4);
                        auVar102._4_4_ = uVar35;
                        auVar102._0_4_ = uVar35;
                        auVar102._8_4_ = uVar35;
                        auVar102._12_4_ = uVar35;
                        auVar102._16_4_ = uVar35;
                        auVar102._20_4_ = uVar35;
                        auVar102._24_4_ = uVar35;
                        auVar102._28_4_ = uVar35;
                        auVar107 = vcmpps_avx(auVar102,auVar99,2);
                        uVar35 = *(undefined4 *)(uVar33 + 0x1e0 + uVar37 * 4);
                        auVar110._4_4_ = uVar35;
                        auVar110._0_4_ = uVar35;
                        auVar110._8_4_ = uVar35;
                        auVar110._12_4_ = uVar35;
                        auVar110._16_4_ = uVar35;
                        auVar110._20_4_ = uVar35;
                        auVar110._24_4_ = uVar35;
                        auVar110._28_4_ = uVar35;
                        auVar99 = vcmpps_avx(auVar99,auVar110,1);
                        auVar99 = vandps_avx(auVar107,auVar99);
                        auVar66 = vandps_avx(auVar99,auVar66);
                      }
                    }
                    else {
                      fVar114 = *(float *)(uVar33 + 0xa0 + uVar37 * 4);
                      fVar119 = *(float *)(uVar33 + 0xc0 + uVar37 * 4);
                      fVar120 = *(float *)(uVar33 + 0xe0 + uVar37 * 4);
                      fVar121 = *(float *)(uVar33 + 0x100 + uVar37 * 4);
                      fVar62 = *(float *)(uVar33 + 0x120 + uVar37 * 4);
                      fStack_5a24 = *(float *)(uVar33 + 0x1c0 + uVar37 * 4);
                      fStack_5a04 = *(float *)(uVar33 + 0x1e0 + uVar37 * 4);
                      fVar72 = *(float *)(uVar33 + 0x200 + uVar37 * 4);
                      fVar74 = *(float *)(uVar33 + 0x220 + uVar37 * 4);
                      fVar76 = *(float *)(uVar33 + 0x240 + uVar37 * 4);
                      fVar78 = *(float *)(uVar33 + 0x260 + uVar37 * 4);
                      auVar99 = *(undefined1 (*) [32])(ray + 0xe0);
                      auVar103._8_4_ = 0x3f800000;
                      auVar103._0_8_ = &DAT_3f8000003f800000;
                      auVar103._12_4_ = 0x3f800000;
                      auVar103._16_4_ = 0x3f800000;
                      auVar103._20_4_ = 0x3f800000;
                      auVar103._24_4_ = 0x3f800000;
                      auVar103._28_4_ = 0x3f800000;
                      auVar66 = vsubps_avx(auVar103,auVar99);
                      fVar147 = auVar99._0_4_;
                      fVar148 = auVar99._4_4_;
                      fVar80 = auVar99._8_4_;
                      fVar82 = auVar99._12_4_;
                      fVar149 = auVar99._16_4_;
                      fVar150 = auVar99._20_4_;
                      fVar44 = auVar99._24_4_;
                      local_59e0 = auVar66._0_4_;
                      fVar151 = local_59e0 * 0.0;
                      fStack_59dc = auVar66._4_4_;
                      fVar152 = fStack_59dc * 0.0;
                      fStack_59d8 = auVar66._8_4_;
                      fStack_5cb8 = fStack_59d8 * 0.0;
                      fStack_59d4 = auVar66._12_4_;
                      fStack_5cb4 = fStack_59d4 * 0.0;
                      fStack_59d0 = auVar66._16_4_;
                      fStack_5cb0 = fStack_59d0 * 0.0;
                      fStack_59cc = auVar66._20_4_;
                      fStack_5cac = fStack_59cc * 0.0;
                      fStack_59c8 = auVar66._24_4_;
                      fStack_5ca8 = fStack_59c8 * 0.0;
                      local_5a40 = fVar151 + fVar147 * fStack_5a24;
                      fStack_5a3c = fVar152 + fVar148 * fStack_5a24;
                      fStack_5a38 = fStack_5cb8 + fVar80 * fStack_5a24;
                      fStack_5a34 = fStack_5cb4 + fVar82 * fStack_5a24;
                      fStack_5a30 = fStack_5cb0 + fVar149 * fStack_5a24;
                      fStack_5a2c = fStack_5cac + fVar150 * fStack_5a24;
                      fStack_5a28 = fStack_5ca8 + fVar44 * fStack_5a24;
                      fStack_5ca4 = in_ZMM15._28_4_;
                      fStack_5a24 = fStack_5ca4 + fStack_5a24;
                      local_5a00 = fVar151 + fVar147 * fStack_5a04;
                      fStack_59fc = fVar152 + fVar148 * fStack_5a04;
                      fStack_59f8 = fStack_5cb8 + fVar80 * fStack_5a04;
                      fStack_59f4 = fStack_5cb4 + fVar82 * fStack_5a04;
                      fStack_59f0 = fStack_5cb0 + fVar149 * fStack_5a04;
                      fStack_59ec = fStack_5cac + fVar150 * fStack_5a04;
                      fStack_59e8 = fStack_5ca8 + fVar44 * fStack_5a04;
                      fStack_59e4 = fStack_5ca4 + fStack_5a04;
                      fStack_5cb8 = fStack_5cb8 + fVar80 * fVar72;
                      fStack_5cb4 = fStack_5cb4 + fVar82 * fVar72;
                      fStack_5cb0 = fStack_5cb0 + fVar149 * fVar72;
                      fStack_5cac = fStack_5cac + fVar150 * fVar72;
                      fStack_5ca8 = fStack_5ca8 + fVar44 * fVar72;
                      fStack_5ca4 = fStack_5ca4 + fVar72;
                      local_5a60 = local_59e0 + fVar147 * fVar74;
                      fStack_5a5c = fStack_59dc + fVar148 * fVar74;
                      fStack_5a58 = fStack_59d8 + fVar80 * fVar74;
                      fStack_5a54 = fStack_59d4 + fVar82 * fVar74;
                      fStack_5a50 = fStack_59d0 + fVar149 * fVar74;
                      fStack_5a4c = fStack_59cc + fVar150 * fVar74;
                      fStack_5a48 = fStack_59c8 + fVar44 * fVar74;
                      fVar56 = auVar66._28_4_;
                      fStack_5a44 = fVar56 + fStack_5ca4;
                      local_5a20 = local_59e0 + fVar147 * fVar76;
                      fStack_5a1c = fStack_59dc + fVar148 * fVar76;
                      fStack_5a18 = fStack_59d8 + fVar80 * fVar76;
                      fStack_5a14 = fStack_59d4 + fVar82 * fVar76;
                      fStack_5a10 = fStack_59d0 + fVar149 * fVar76;
                      fStack_5a0c = fStack_59cc + fVar150 * fVar76;
                      fStack_5a08 = fStack_59c8 + fVar44 * fVar76;
                      fStack_5a04 = fVar56 + fStack_5a04;
                      local_59e0 = local_59e0 + fVar147 * fVar78;
                      fStack_59dc = fStack_59dc + fVar148 * fVar78;
                      fStack_59d8 = fStack_59d8 + fVar80 * fVar78;
                      fStack_59d4 = fStack_59d4 + fVar82 * fVar78;
                      fStack_59d0 = fStack_59d0 + fVar149 * fVar78;
                      fStack_59cc = fStack_59cc + fVar150 * fVar78;
                      fStack_59c8 = fStack_59c8 + fVar44 * fVar78;
                      fStack_59c4 = fVar56 + fVar72;
                      fVar76 = *(float *)(uVar33 + 0x140 + uVar37 * 4);
                      in_ZMM15 = ZEXT3264(CONCAT428(fVar76,CONCAT424(fVar76,CONCAT420(fVar76,
                                                  CONCAT416(fVar76,CONCAT412(fVar76,CONCAT48(fVar76,
                                                  CONCAT44(fVar76,fVar76))))))));
                      fVar80 = *(float *)(uVar33 + 0x40 + uVar37 * 4);
                      fVar82 = *(float *)(uVar33 + 0x60 + uVar37 * 4);
                      auVar111._0_4_ =
                           fVar80 * (float)local_5c20._0_4_ +
                           fVar114 * (float)local_5c00._0_4_ + fVar121 * (float)local_5be0._0_4_;
                      auVar111._4_4_ =
                           fVar80 * (float)local_5c20._4_4_ +
                           fVar114 * (float)local_5c00._4_4_ + fVar121 * (float)local_5be0._4_4_;
                      auVar111._8_4_ =
                           fVar80 * fStack_5c18 + fVar114 * fStack_5bf8 + fVar121 * fStack_5bd8;
                      auVar111._12_4_ =
                           fVar80 * fStack_5c14 + fVar114 * fStack_5bf4 + fVar121 * fStack_5bd4;
                      auVar111._16_4_ =
                           fVar80 * fStack_5c10 + fVar114 * fStack_5bf0 + fVar121 * fStack_5bd0;
                      auVar111._20_4_ =
                           fVar80 * fStack_5c0c + fVar114 * fStack_5bec + fVar121 * fStack_5bcc;
                      auVar111._24_4_ =
                           fVar80 * fStack_5c08 + fVar114 * fStack_5be8 + fVar121 * fStack_5bc8;
                      auVar111._28_4_ = fVar56 + auVar99._28_4_ + fVar72;
                      fVar149 = *(float *)(uVar33 + 0x80 + uVar37 * 4);
                      auVar89._0_4_ =
                           fVar82 * (float)local_5c20._0_4_ +
                           fVar119 * (float)local_5c00._0_4_ + fVar62 * (float)local_5be0._0_4_;
                      auVar89._4_4_ =
                           fVar82 * (float)local_5c20._4_4_ +
                           fVar119 * (float)local_5c00._4_4_ + fVar62 * (float)local_5be0._4_4_;
                      auVar89._8_4_ =
                           fVar82 * fStack_5c18 + fVar119 * fStack_5bf8 + fVar62 * fStack_5bd8;
                      auVar89._12_4_ =
                           fVar82 * fStack_5c14 + fVar119 * fStack_5bf4 + fVar62 * fStack_5bd4;
                      auVar89._16_4_ =
                           fVar82 * fStack_5c10 + fVar119 * fStack_5bf0 + fVar62 * fStack_5bd0;
                      auVar89._20_4_ =
                           fVar82 * fStack_5c0c + fVar119 * fStack_5bec + fVar62 * fStack_5bcc;
                      auVar89._24_4_ =
                           fVar82 * fStack_5c08 + fVar119 * fStack_5be8 + fVar62 * fStack_5bc8;
                      auVar89._28_4_ = fVar74 + auVar99._28_4_ + fVar78;
                      auVar52._0_4_ =
                           fVar149 * (float)local_5c20._0_4_ +
                           fVar120 * (float)local_5c00._0_4_ + fVar76 * (float)local_5be0._0_4_;
                      auVar52._4_4_ =
                           fVar149 * (float)local_5c20._4_4_ +
                           fVar120 * (float)local_5c00._4_4_ + fVar76 * (float)local_5be0._4_4_;
                      auVar52._8_4_ =
                           fVar149 * fStack_5c18 + fVar120 * fStack_5bf8 + fVar76 * fStack_5bd8;
                      auVar52._12_4_ =
                           fVar149 * fStack_5c14 + fVar120 * fStack_5bf4 + fVar76 * fStack_5bd4;
                      auVar52._16_4_ =
                           fVar149 * fStack_5c10 + fVar120 * fStack_5bf0 + fVar76 * fStack_5bd0;
                      auVar52._20_4_ =
                           fVar149 * fStack_5c0c + fVar120 * fStack_5bec + fVar76 * fStack_5bcc;
                      auVar52._24_4_ =
                           fVar149 * fStack_5c08 + fVar120 * fStack_5be8 + fVar76 * fStack_5bc8;
                      auVar52._28_4_ = fStack_5c04 + fStack_5be4 + fStack_5bc4;
                      auVar129._8_4_ = 0x7fffffff;
                      auVar129._0_8_ = 0x7fffffff7fffffff;
                      auVar129._12_4_ = 0x7fffffff;
                      auVar129._16_4_ = 0x7fffffff;
                      auVar129._20_4_ = 0x7fffffff;
                      auVar129._24_4_ = 0x7fffffff;
                      auVar129._28_4_ = 0x7fffffff;
                      auVar99 = vandps_avx(auVar111,auVar129);
                      auVar137._8_4_ = 0x219392ef;
                      auVar137._0_8_ = 0x219392ef219392ef;
                      auVar137._12_4_ = 0x219392ef;
                      auVar137._16_4_ = 0x219392ef;
                      auVar137._20_4_ = 0x219392ef;
                      auVar137._24_4_ = 0x219392ef;
                      auVar137._28_4_ = 0x219392ef;
                      auVar99 = vcmpps_avx(auVar99,auVar137,1);
                      auVar66 = vblendvps_avx(auVar111,auVar137,auVar99);
                      auVar99 = vandps_avx(auVar89,auVar129);
                      auVar99 = vcmpps_avx(auVar99,auVar137,1);
                      auVar107 = vblendvps_avx(auVar89,auVar137,auVar99);
                      auVar99 = vandps_avx(auVar52,auVar129);
                      auVar99 = vcmpps_avx(auVar99,auVar137,1);
                      auVar95 = vrcpps_avx(auVar66);
                      auVar99 = vblendvps_avx(auVar52,auVar137,auVar99);
                      fVar127 = auVar95._0_4_;
                      fVar130 = auVar95._4_4_;
                      auVar10._4_4_ = fVar130 * auVar66._4_4_;
                      auVar10._0_4_ = fVar127 * auVar66._0_4_;
                      fVar131 = auVar95._8_4_;
                      auVar10._8_4_ = fVar131 * auVar66._8_4_;
                      fVar132 = auVar95._12_4_;
                      auVar10._12_4_ = fVar132 * auVar66._12_4_;
                      fVar133 = auVar95._16_4_;
                      auVar10._16_4_ = fVar133 * auVar66._16_4_;
                      fVar134 = auVar95._20_4_;
                      auVar10._20_4_ = fVar134 * auVar66._20_4_;
                      fVar135 = auVar95._24_4_;
                      auVar10._24_4_ = fVar135 * auVar66._24_4_;
                      auVar10._28_4_ = auVar66._28_4_;
                      auVar95 = vsubps_avx(auVar103,auVar10);
                      auVar66 = vrcpps_avx(auVar107);
                      fVar127 = fVar127 + fVar127 * auVar95._0_4_;
                      fVar130 = fVar130 + fVar130 * auVar95._4_4_;
                      fVar131 = fVar131 + fVar131 * auVar95._8_4_;
                      fVar132 = fVar132 + fVar132 * auVar95._12_4_;
                      fVar133 = fVar133 + fVar133 * auVar95._16_4_;
                      fVar134 = fVar134 + fVar134 * auVar95._20_4_;
                      fVar135 = fVar135 + fVar135 * auVar95._24_4_;
                      fVar63 = auVar66._0_4_;
                      fVar73 = auVar66._4_4_;
                      auVar11._4_4_ = fVar73 * auVar107._4_4_;
                      auVar11._0_4_ = fVar63 * auVar107._0_4_;
                      fVar75 = auVar66._8_4_;
                      auVar11._8_4_ = fVar75 * auVar107._8_4_;
                      fVar77 = auVar66._12_4_;
                      auVar11._12_4_ = fVar77 * auVar107._12_4_;
                      fVar79 = auVar66._16_4_;
                      auVar11._16_4_ = fVar79 * auVar107._16_4_;
                      fVar81 = auVar66._20_4_;
                      auVar11._20_4_ = fVar81 * auVar107._20_4_;
                      fVar83 = auVar66._24_4_;
                      auVar11._24_4_ = fVar83 * auVar107._24_4_;
                      auVar11._28_4_ = auVar95._28_4_;
                      auVar95 = vsubps_avx(auVar103,auVar11);
                      fVar63 = fVar63 + fVar63 * auVar95._0_4_;
                      fVar73 = fVar73 + fVar73 * auVar95._4_4_;
                      fVar75 = fVar75 + fVar75 * auVar95._8_4_;
                      fVar77 = fVar77 + fVar77 * auVar95._12_4_;
                      fVar79 = fVar79 + fVar79 * auVar95._16_4_;
                      fVar81 = fVar81 + fVar81 * auVar95._20_4_;
                      fVar83 = fVar83 + fVar83 * auVar95._24_4_;
                      auVar107 = vrcpps_avx(auVar99);
                      fVar44 = auVar107._0_4_;
                      fVar56 = auVar107._4_4_;
                      auVar12._4_4_ = fVar56 * auVar99._4_4_;
                      auVar12._0_4_ = fVar44 * auVar99._0_4_;
                      fVar57 = auVar107._8_4_;
                      auVar12._8_4_ = fVar57 * auVar99._8_4_;
                      fVar58 = auVar107._12_4_;
                      auVar12._12_4_ = fVar58 * auVar99._12_4_;
                      fVar59 = auVar107._16_4_;
                      auVar12._16_4_ = fVar59 * auVar99._16_4_;
                      fVar60 = auVar107._20_4_;
                      auVar12._20_4_ = fVar60 * auVar99._20_4_;
                      fVar61 = auVar107._24_4_;
                      auVar12._24_4_ = fVar61 * auVar99._24_4_;
                      auVar12._28_4_ = auVar99._28_4_;
                      auVar99 = vsubps_avx(auVar103,auVar12);
                      fVar44 = fVar44 + fVar44 * auVar99._0_4_;
                      fVar56 = fVar56 + fVar56 * auVar99._4_4_;
                      fVar57 = fVar57 + fVar57 * auVar99._8_4_;
                      fVar58 = fVar58 + fVar58 * auVar99._12_4_;
                      fVar59 = fVar59 + fVar59 * auVar99._16_4_;
                      fVar60 = fVar60 + fVar60 * auVar99._20_4_;
                      fVar61 = fVar61 + fVar61 * auVar99._24_4_;
                      fVar74 = *(float *)(uVar33 + 0x160 + uVar37 * 4);
                      fVar113 = fVar74 + auVar66._28_4_;
                      fVar78 = *(float *)(uVar33 + 0x180 + uVar37 * 4);
                      fVar150 = *(float *)(uVar33 + 0x1a0 + uVar37 * 4);
                      fVar105 = fVar113 + 1.0;
                      auVar126._0_4_ =
                           fVar80 * (float)local_5c80._0_4_ +
                           fVar114 * (float)local_5c80._32_4_ +
                           fVar74 + fVar121 * (float)local_5c80._64_4_;
                      auVar126._4_4_ =
                           fVar80 * (float)local_5c80._4_4_ +
                           fVar114 * (float)local_5c80._36_4_ +
                           fVar74 + fVar121 * (float)local_5c80._68_4_;
                      auVar126._8_4_ =
                           fVar80 * (float)local_5c80._8_4_ +
                           fVar114 * (float)local_5c80._40_4_ +
                           fVar74 + fVar121 * (float)local_5c80._72_4_;
                      auVar126._12_4_ =
                           fVar80 * (float)local_5c80._12_4_ +
                           fVar114 * (float)local_5c80._44_4_ +
                           fVar74 + fVar121 * (float)local_5c80._76_4_;
                      auVar126._16_4_ =
                           fVar80 * (float)local_5c80._16_4_ +
                           fVar114 * (float)local_5c80._48_4_ +
                           fVar74 + fVar121 * (float)local_5c80._80_4_;
                      auVar126._20_4_ =
                           fVar80 * (float)local_5c80._20_4_ +
                           fVar114 * (float)local_5c80._52_4_ +
                           fVar74 + fVar121 * (float)local_5c80._84_4_;
                      auVar126._24_4_ =
                           fVar80 * (float)local_5c80._24_4_ +
                           fVar114 * (float)local_5c80._56_4_ +
                           fVar74 + fVar121 * (float)local_5c80._88_4_;
                      auVar126._28_4_ = fVar119 + fVar105;
                      auVar112._0_4_ =
                           fVar82 * (float)local_5c80._0_4_ +
                           fVar78 + fVar62 * (float)local_5c80._64_4_ +
                           (float)local_5c80._32_4_ * fVar119;
                      auVar112._4_4_ =
                           fVar82 * (float)local_5c80._4_4_ +
                           fVar78 + fVar62 * (float)local_5c80._68_4_ +
                           (float)local_5c80._36_4_ * fVar119;
                      auVar112._8_4_ =
                           fVar82 * (float)local_5c80._8_4_ +
                           fVar78 + fVar62 * (float)local_5c80._72_4_ +
                           (float)local_5c80._40_4_ * fVar119;
                      auVar112._12_4_ =
                           fVar82 * (float)local_5c80._12_4_ +
                           fVar78 + fVar62 * (float)local_5c80._76_4_ +
                           (float)local_5c80._44_4_ * fVar119;
                      auVar112._16_4_ =
                           fVar82 * (float)local_5c80._16_4_ +
                           fVar78 + fVar62 * (float)local_5c80._80_4_ +
                           (float)local_5c80._48_4_ * fVar119;
                      auVar112._20_4_ =
                           fVar82 * (float)local_5c80._20_4_ +
                           fVar78 + fVar62 * (float)local_5c80._84_4_ +
                           (float)local_5c80._52_4_ * fVar119;
                      auVar112._24_4_ =
                           fVar82 * (float)local_5c80._24_4_ +
                           fVar78 + fVar62 * (float)local_5c80._88_4_ +
                           (float)local_5c80._56_4_ * fVar119;
                      auVar112._28_4_ = fVar105 + fVar78 + fVar62 + fVar113;
                      auVar142._0_4_ =
                           fVar149 * (float)local_5c80._0_4_ +
                           (float)local_5c80._32_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._64_4_;
                      auVar142._4_4_ =
                           fVar149 * (float)local_5c80._4_4_ +
                           (float)local_5c80._36_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._68_4_;
                      auVar142._8_4_ =
                           fVar149 * (float)local_5c80._8_4_ +
                           (float)local_5c80._40_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._72_4_;
                      auVar142._12_4_ =
                           fVar149 * (float)local_5c80._12_4_ +
                           (float)local_5c80._44_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._76_4_;
                      auVar142._16_4_ =
                           fVar149 * (float)local_5c80._16_4_ +
                           (float)local_5c80._48_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._80_4_;
                      auVar142._20_4_ =
                           fVar149 * (float)local_5c80._20_4_ +
                           (float)local_5c80._52_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._84_4_;
                      auVar142._24_4_ =
                           fVar149 * (float)local_5c80._24_4_ +
                           (float)local_5c80._56_4_ * fVar120 +
                           fVar150 + fVar76 * (float)local_5c80._88_4_;
                      auVar142._28_4_ = fVar105 + fVar120 + fVar150 + (float)local_5c80._92_4_;
                      auVar28._4_4_ = fStack_5a3c;
                      auVar28._0_4_ = local_5a40;
                      auVar28._8_4_ = fStack_5a38;
                      auVar28._12_4_ = fStack_5a34;
                      auVar28._16_4_ = fStack_5a30;
                      auVar28._20_4_ = fStack_5a2c;
                      auVar28._24_4_ = fStack_5a28;
                      auVar28._28_4_ = fStack_5a24;
                      auVar96 = vsubps_avx(auVar28,auVar126);
                      auVar116._0_4_ = fVar127 * auVar96._0_4_;
                      auVar116._4_4_ = fVar130 * auVar96._4_4_;
                      auVar116._8_4_ = fVar131 * auVar96._8_4_;
                      auVar116._12_4_ = fVar132 * auVar96._12_4_;
                      auVar13._16_4_ = fVar133 * auVar96._16_4_;
                      auVar13._0_16_ = auVar116;
                      auVar13._20_4_ = fVar134 * auVar96._20_4_;
                      auVar13._24_4_ = fVar135 * auVar96._24_4_;
                      auVar13._28_4_ = local_5c80._28_4_;
                      auVar30._4_4_ = fStack_59fc;
                      auVar30._0_4_ = local_5a00;
                      auVar30._8_4_ = fStack_59f8;
                      auVar30._12_4_ = fStack_59f4;
                      auVar30._16_4_ = fStack_59f0;
                      auVar30._20_4_ = fStack_59ec;
                      auVar30._24_4_ = fStack_59e8;
                      auVar30._28_4_ = fStack_59e4;
                      auVar96 = vsubps_avx(auVar30,auVar112);
                      auVar86._0_4_ = fVar63 * auVar96._0_4_;
                      auVar86._4_4_ = fVar73 * auVar96._4_4_;
                      auVar86._8_4_ = fVar75 * auVar96._8_4_;
                      auVar86._12_4_ = fVar77 * auVar96._12_4_;
                      auVar14._16_4_ = fVar79 * auVar96._16_4_;
                      auVar14._0_16_ = auVar86;
                      auVar14._20_4_ = fVar81 * auVar96._20_4_;
                      auVar14._24_4_ = fVar83 * auVar96._24_4_;
                      auVar14._28_4_ = auVar96._28_4_;
                      auVar21._4_4_ = fVar152 + fVar148 * fVar72;
                      auVar21._0_4_ = fVar151 + fVar147 * fVar72;
                      auVar21._8_4_ = fStack_5cb8;
                      auVar21._12_4_ = fStack_5cb4;
                      auVar21._16_4_ = fStack_5cb0;
                      auVar21._20_4_ = fStack_5cac;
                      auVar21._24_4_ = fStack_5ca8;
                      auVar21._28_4_ = fStack_5ca4;
                      auVar97 = vsubps_avx(auVar21,auVar142);
                      auVar93._0_4_ = fVar44 * auVar97._0_4_;
                      auVar93._4_4_ = fVar56 * auVar97._4_4_;
                      auVar93._8_4_ = fVar57 * auVar97._8_4_;
                      auVar93._12_4_ = fVar58 * auVar97._12_4_;
                      auVar15._16_4_ = fVar59 * auVar97._16_4_;
                      auVar15._0_16_ = auVar93;
                      auVar15._20_4_ = fVar60 * auVar97._20_4_;
                      auVar15._24_4_ = fVar61 * auVar97._24_4_;
                      auVar15._28_4_ = auVar97._28_4_;
                      auVar27._4_4_ = fStack_5a5c;
                      auVar27._0_4_ = local_5a60;
                      auVar27._8_4_ = fStack_5a58;
                      auVar27._12_4_ = fStack_5a54;
                      auVar27._16_4_ = fStack_5a50;
                      auVar27._20_4_ = fStack_5a4c;
                      auVar27._24_4_ = fStack_5a48;
                      auVar27._28_4_ = fStack_5a44;
                      auVar97 = vsubps_avx(auVar27,auVar126);
                      auVar123._0_4_ = fVar127 * auVar97._0_4_;
                      auVar123._4_4_ = fVar130 * auVar97._4_4_;
                      auVar123._8_4_ = fVar131 * auVar97._8_4_;
                      auVar123._12_4_ = fVar132 * auVar97._12_4_;
                      auVar16._16_4_ = fVar133 * auVar97._16_4_;
                      auVar16._0_16_ = auVar123;
                      auVar16._20_4_ = fVar134 * auVar97._20_4_;
                      auVar16._24_4_ = fVar135 * auVar97._24_4_;
                      auVar16._28_4_ = auVar97._28_4_;
                      auVar29._4_4_ = fStack_5a1c;
                      auVar29._0_4_ = local_5a20;
                      auVar29._8_4_ = fStack_5a18;
                      auVar29._12_4_ = fStack_5a14;
                      auVar29._16_4_ = fStack_5a10;
                      auVar29._20_4_ = fStack_5a0c;
                      auVar29._24_4_ = fStack_5a08;
                      auVar29._28_4_ = fStack_5a04;
                      auVar97 = vsubps_avx(auVar29,auVar112);
                      auVar64._0_4_ = fVar63 * auVar97._0_4_;
                      auVar64._4_4_ = fVar73 * auVar97._4_4_;
                      auVar64._8_4_ = fVar75 * auVar97._8_4_;
                      auVar64._12_4_ = fVar77 * auVar97._12_4_;
                      auVar17._16_4_ = fVar79 * auVar97._16_4_;
                      auVar17._0_16_ = auVar64;
                      auVar17._20_4_ = fVar81 * auVar97._20_4_;
                      auVar17._24_4_ = fVar83 * auVar97._24_4_;
                      auVar17._28_4_ = auVar66._28_4_ + auVar95._28_4_;
                      auVar31._4_4_ = fStack_59dc;
                      auVar31._0_4_ = local_59e0;
                      auVar31._8_4_ = fStack_59d8;
                      auVar31._12_4_ = fStack_59d4;
                      auVar31._16_4_ = fStack_59d0;
                      auVar31._20_4_ = fStack_59cc;
                      auVar31._24_4_ = fStack_59c8;
                      auVar31._28_4_ = fStack_59c4;
                      auVar66 = vsubps_avx(auVar31,auVar142);
                      auVar47._0_4_ = fVar44 * auVar66._0_4_;
                      auVar47._4_4_ = fVar56 * auVar66._4_4_;
                      auVar47._8_4_ = fVar57 * auVar66._8_4_;
                      auVar47._12_4_ = fVar58 * auVar66._12_4_;
                      auVar18._16_4_ = fVar59 * auVar66._16_4_;
                      auVar18._0_16_ = auVar47;
                      auVar18._20_4_ = fVar60 * auVar66._20_4_;
                      auVar18._24_4_ = fVar61 * auVar66._24_4_;
                      auVar18._28_4_ = auVar107._28_4_ + auVar99._28_4_;
                      auVar49 = vpminsd_avx(auVar13._16_16_,auVar16._16_16_);
                      auVar94 = vpminsd_avx(auVar116,auVar123);
                      auVar65 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
                      auVar49 = vpmaxsd_avx(auVar49,auVar65);
                      auVar65 = vpminsd_avx(auVar86,auVar64);
                      auVar94 = vpmaxsd_avx(auVar94,auVar65);
                      auVar65 = vpminsd_avx(auVar93,auVar47);
                      auVar94 = vpmaxsd_avx(auVar94,auVar65);
                      auVar65 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
                      auVar49 = vpmaxsd_avx(auVar49,auVar65);
                      auVar65 = vpmaxsd_avx(auVar13._16_16_,auVar16._16_16_);
                      auVar144 = vpmaxsd_avx(auVar116,auVar123);
                      auVar140 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
                      auVar140 = vpminsd_avx(auVar65,auVar140);
                      auVar65 = vpmaxsd_avx(auVar86,auVar64);
                      auVar144 = vpminsd_avx(auVar144,auVar65);
                      auVar65 = vpmaxsd_avx(auVar93,auVar47);
                      auVar144 = vpminsd_avx(auVar144,auVar65);
                      auVar65 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
                      auVar65 = vpminsd_avx(auVar140,auVar65);
                      auVar87._0_4_ = auVar94._0_4_ * 0.99999964;
                      auVar87._4_4_ = auVar94._4_4_ * 0.99999964;
                      auVar87._8_4_ = auVar94._8_4_ * 0.99999964;
                      auVar87._12_4_ = auVar94._12_4_ * 0.99999964;
                      auVar19._16_4_ = auVar49._0_4_ * 0.99999964;
                      auVar19._0_16_ = auVar87;
                      auVar19._20_4_ = auVar49._4_4_ * 0.99999964;
                      auVar19._24_4_ = auVar49._8_4_ * 0.99999964;
                      auVar19._28_4_ = auVar96._28_4_;
                      auVar91 = ZEXT3264(auVar19);
                      auVar48._0_4_ = auVar144._0_4_ * 1.0000004;
                      auVar48._4_4_ = auVar144._4_4_ * 1.0000004;
                      auVar48._8_4_ = auVar144._8_4_ * 1.0000004;
                      auVar48._12_4_ = auVar144._12_4_ * 1.0000004;
                      auVar20._16_4_ = auVar65._0_4_ * 1.0000004;
                      auVar20._0_16_ = auVar48;
                      auVar20._20_4_ = auVar65._4_4_ * 1.0000004;
                      auVar20._24_4_ = auVar65._8_4_ * 1.0000004;
                      auVar20._28_4_ = auVar65._12_4_;
                      auVar49 = vpmaxsd_avx(auVar87,local_5b00._0_16_);
                      auVar94 = vpmaxsd_avx(auVar19._16_16_,local_5b00._16_16_);
                      auVar65 = vpminsd_avx(auVar48,local_5ae0._0_16_);
                      auVar68._16_16_ = auVar94;
                      auVar68._0_16_ = auVar49;
                      auVar49 = vpminsd_avx(auVar20._16_16_,local_5ae0._16_16_);
                      auVar53._16_16_ = auVar49;
                      auVar53._0_16_ = auVar65;
                      auVar66 = vcmpps_avx(auVar68,auVar53,2);
                    }
                    auVar49 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
                    auVar94 = vpackssdw_avx(local_5ca0._0_16_,local_5ca0._16_16_);
                    auVar49 = vpand_avx(auVar49,auVar94);
                    auVar94 = vpmovzxwd_avx(auVar49);
                    auVar65 = vpslld_avx(auVar94,0x1f);
                    auVar94 = vpunpckhwd_avx(auVar49,auVar49);
                    auVar94 = vpslld_avx(auVar94,0x1f);
                    auVar104._16_16_ = auVar94;
                    auVar104._0_16_ = auVar65;
                    local_5ce0 = auVar67;
                    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar104 >> 0x7f,0) == '\0') &&
                          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB161(auVar94 >> 0x3f,0) == '\0') &&
                        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar94[0xf]) {
                      auVar71 = ZEXT3264(auVar67);
                    }
                    else {
                      auVar49 = vpunpckhwd_avx(auVar49,auVar49);
                      auVar49 = vpslld_avx(auVar49,0x1f);
                      auVar54._16_16_ = auVar49;
                      auVar54._0_16_ = auVar65;
                      auVar69._8_4_ = 0x7f800000;
                      auVar69._0_8_ = 0x7f8000007f800000;
                      auVar69._12_4_ = 0x7f800000;
                      auVar69._16_4_ = 0x7f800000;
                      auVar69._20_4_ = 0x7f800000;
                      auVar69._24_4_ = 0x7f800000;
                      auVar69._28_4_ = 0x7f800000;
                      auVar67 = vblendvps_avx(auVar69,auVar91._0_32_,auVar54);
                      if (root.ptr != 8) {
                        *puVar41 = root.ptr;
                        puVar41 = puVar41 + 1;
                        local_5ce0._0_8_ = auVar71._0_8_;
                        local_5ce0._8_8_ = auVar71._8_8_;
                        local_5ce0._16_8_ = auVar71._16_8_;
                        local_5ce0._24_8_ = auVar71._24_8_;
                        *(undefined8 *)*pauVar42 = local_5ce0._0_8_;
                        *(undefined8 *)(*pauVar42 + 8) = local_5ce0._8_8_;
                        *(undefined8 *)(*pauVar42 + 0x10) = local_5ce0._16_8_;
                        *(undefined8 *)(*pauVar42 + 0x18) = local_5ce0._24_8_;
                        pauVar42 = pauVar42 + 1;
                      }
                      auVar71 = ZEXT3264(auVar67);
                      root.ptr = uVar1;
                    }
                  }
                } while ((uVar1 != 8) && (bVar43 = uVar37 < 7, uVar37 = uVar37 + 1, bVar43));
                iVar39 = 0;
                if (root.ptr == 8) {
LAB_00492fab:
                  pRVar38 = (RayQueryContext *)0x0;
                  iVar39 = 4;
                }
                else {
                  auVar67 = vcmpps_avx(local_5ae0,auVar71._0_32_,6);
                  uVar35 = vmovmskps_avx(auVar67);
                  pRVar38 = (RayQueryContext *)0x1;
                  if ((uint)POPCOUNT(uVar35) <= uVar34) {
                    *puVar41 = root.ptr;
                    puVar41 = puVar41 + 1;
                    *pauVar42 = auVar71._0_32_;
                    pauVar42 = pauVar42 + 1;
                    goto LAB_00492fab;
                  }
                }
              } while ((char)pRVar38 != '\0');
            }
          }
        }
      } while (iVar39 != 3);
      auVar67 = vandps_avx(local_5ac0,_local_5d00);
      auVar70._8_4_ = 0xff800000;
      auVar70._0_8_ = 0xff800000ff800000;
      auVar70._12_4_ = 0xff800000;
      auVar70._16_4_ = 0xff800000;
      auVar70._20_4_ = 0xff800000;
      auVar70._24_4_ = 0xff800000;
      auVar70._28_4_ = 0xff800000;
      auVar67 = vmaskmovps_avx(auVar67,auVar70);
      *(undefined1 (*) [32])(ray + 0x100) = auVar67;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }